

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Node::EndPropertiesBinary(Node *this,StreamWriterLE *s,size_t num_properties)

{
  ulong uVar1;
  size_t pOffset;
  
  if (num_properties == 0) {
    return;
  }
  pOffset = StreamWriter<false,_false>::Tell(s);
  uVar1 = this->property_start;
  if (uVar1 < pOffset) {
    StreamWriter<false,_false>::Seek(s,this->start_pos + 4,aiOrigin_SET);
    StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)num_properties);
    StreamWriter<false,_false>::Put<unsigned_int>(s,(int)pOffset - (int)uVar1);
    StreamWriter<false,_false>::Seek(s,pOffset,aiOrigin_SET);
    return;
  }
  __assert_fail("pos > property_start",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXExportNode.cpp"
                ,0x161,
                "void Assimp::FBX::Node::EndPropertiesBinary(Assimp::StreamWriterLE &, size_t)");
}

Assistant:

void FBX::Node::EndPropertiesBinary(
    Assimp::StreamWriterLE &s,
    size_t num_properties
) {
    if (num_properties == 0) { return; }
    size_t pos = s.Tell();
    ai_assert(pos > property_start);
    size_t property_section_size = pos - property_start;
    s.Seek(start_pos + 4);
    s.PutU4(uint32_t(num_properties));
    s.PutU4(uint32_t(property_section_size));
    s.Seek(pos);
}